

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::set_lr0_contexts(StatesInProgress *states,Grammar *grammar)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference this;
  type pSVar4;
  Context *this_00;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  value_type_conflict1 local_7c;
  _Rb_tree_const_iterator<int> _Stack_78;
  int terminal;
  undefined1 local_70;
  int local_64;
  reference local_60;
  ActionInProgress *action;
  iterator __end2;
  iterator __begin2;
  vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_> *__range2;
  StateInProgress *state;
  unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_> *state_uptr;
  iterator __end1;
  iterator __begin1;
  StatesInProgress *__range1;
  Grammar *grammar_local;
  StatesInProgress *states_local;
  
  __end1 = std::
           vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
           ::begin(states);
  state_uptr = (unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
                *)std::
                  vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                  ::end(states);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_*,_std::vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>_>
                                     *)&state_uptr), bVar2) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_*,_std::vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>_>
           ::operator*(&__end1);
    pSVar4 = std::
             unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>::
             operator*(this);
    __end2 = std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::
             begin(&pSVar4->actions);
    action = (ActionInProgress *)
             std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::end
                       (&pSVar4->actions);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                                       *)&action), bVar2) {
      local_60 = __gnu_cxx::
                 __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                 ::operator*(&__end2);
      if ((local_60->action).kind == ACTION_REDUCE) {
        iVar1 = (local_60->action).field_1.production;
        iVar3 = get_accept_production(grammar);
        if (iVar1 == iVar3) {
          this_00 = &local_60->context;
          local_64 = get_end_terminal(grammar);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_00,&local_64);
          _Stack_78 = pVar5.first._M_node;
          local_70 = pVar5.second;
        }
        else {
          for (local_7c = 0; local_7c < grammar->nterminals; local_7c = local_7c + 1) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (&local_60->context,&local_7c);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_*,_std::vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void set_lr0_contexts(StatesInProgress& states, Grammar const& grammar) {
  for (auto& state_uptr : states) {
    auto& state = *state_uptr;
    for (auto& action : state.actions) {
      if (action.action.kind != ACTION_REDUCE) continue;
      if (action.action.production == get_accept_production(grammar)) {
        action.context.insert(get_end_terminal(grammar));
      } else {
        for (int terminal = 0; terminal < grammar.nterminals; ++terminal) {
          action.context.insert(terminal);
        }
      }
    }
  }
}